

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void __thiscall
helics::apps::Connector::scanUnconnectedInterfaces
          (Connector *this,ConnectionsList *possibleConnections)

{
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *puVar1;
  string_view *psVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  _Base_ptr p_Var6;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *puVar7;
  basic_string_view<char,_std::char_traits<char>_> *uInp;
  string_view *psVar8;
  size_type __rlen;
  int iVar9;
  string_view sVar10;
  string_view target;
  string_view target_00;
  string_view target_01;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_60;
  
  psVar8 = (possibleConnections->unconnectedInputs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (possibleConnections->unconnectedInputs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar2) {
    puVar1 = &possibleConnections->potentialPubs;
    do {
      puVar7 = puVar1;
      bVar4 = makePotentialConnection
                        (this,*psVar8,&possibleConnections->tagCodes,puVar1,
                         &possibleConnections->aliases);
      if ((!bVar4) && ((possibleConnections->aliases)._M_h._M_element_count != 0)) {
        sVar10._M_str = (char *)possibleConnections;
        sVar10._M_len = (size_t)psVar8->_M_str;
        generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)&local_60,(apps *)psVar8->_M_len,sVar10,
                        (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                         *)puVar7);
        for (p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          sVar3 = *(size_t *)(p_Var6 + 1);
          sVar10 = *(string_view *)(p_Var6 + 1);
          if (sVar3 == psVar8->_M_len) {
            iVar9 = 5;
            if (sVar3 != 0) {
              iVar5 = bcmp(p_Var6[1]._M_parent,psVar8->_M_str,sVar3);
              if (iVar5 != 0) goto LAB_002a1408;
            }
          }
          else {
LAB_002a1408:
            bVar4 = makePotentialConnection
                              (this,sVar10,&possibleConnections->tagCodes,puVar1,
                               &possibleConnections->aliases);
            iVar9 = (uint)bVar4 << 2;
          }
          if ((iVar9 != 5) && (iVar9 != 0)) break;
        }
        std::
        _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::~_Rb_tree(&local_60);
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar2);
  }
  psVar8 = (possibleConnections->unconnectedPubs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (possibleConnections->unconnectedPubs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar2) {
    puVar1 = &possibleConnections->potentialInputs;
    do {
      puVar7 = puVar1;
      bVar4 = makePotentialConnection
                        (this,*psVar8,&possibleConnections->tagCodes,puVar1,
                         &possibleConnections->aliases);
      if ((!bVar4) && ((possibleConnections->aliases)._M_h._M_element_count != 0)) {
        target._M_str = (char *)possibleConnections;
        target._M_len = (size_t)psVar8->_M_str;
        generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)&local_60,(apps *)psVar8->_M_len,target,
                        (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                         *)puVar7);
        for (p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          sVar3 = *(size_t *)(p_Var6 + 1);
          sVar10 = *(string_view *)(p_Var6 + 1);
          if (sVar3 == psVar8->_M_len) {
            iVar9 = 9;
            if (sVar3 != 0) {
              iVar5 = bcmp(p_Var6[1]._M_parent,psVar8->_M_str,sVar3);
              if (iVar5 != 0) goto LAB_002a151a;
            }
          }
          else {
LAB_002a151a:
            bVar4 = makePotentialConnection
                              (this,sVar10,&possibleConnections->tagCodes,puVar1,
                               &possibleConnections->aliases);
            iVar9 = (uint)bVar4 << 3;
          }
          if ((iVar9 != 9) && (iVar9 != 0)) break;
        }
        std::
        _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::~_Rb_tree(&local_60);
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar2);
  }
  psVar8 = (possibleConnections->unconnectedSourceEndpoints).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (possibleConnections->unconnectedSourceEndpoints).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar2) {
    puVar1 = &possibleConnections->potentialEndpoints;
    do {
      puVar7 = puVar1;
      bVar4 = makePotentialConnection
                        (this,*psVar8,&possibleConnections->tagCodes,puVar1,
                         &possibleConnections->aliases);
      if ((!bVar4) && ((possibleConnections->aliases)._M_h._M_element_count != 0)) {
        target_00._M_str = (char *)possibleConnections;
        target_00._M_len = (size_t)psVar8->_M_str;
        generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)&local_60,(apps *)psVar8->_M_len,target_00,
                        (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                         *)puVar7);
        for (p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          sVar3 = *(size_t *)(p_Var6 + 1);
          sVar10 = *(string_view *)(p_Var6 + 1);
          if (sVar3 == psVar8->_M_len) {
            iVar9 = 0xd;
            if (sVar3 != 0) {
              iVar5 = bcmp(p_Var6[1]._M_parent,psVar8->_M_str,sVar3);
              if (iVar5 != 0) goto LAB_002a1632;
            }
          }
          else {
LAB_002a1632:
            bVar4 = makePotentialConnection
                              (this,sVar10,&possibleConnections->tagCodes,puVar1,
                               &possibleConnections->aliases);
            iVar9 = 0xc;
            if (!bVar4) {
              iVar9 = 0;
            }
          }
          if ((iVar9 != 0xd) && (iVar9 != 0)) break;
        }
        std::
        _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::~_Rb_tree(&local_60);
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar2);
  }
  psVar8 = (possibleConnections->unconnectedTargetEndpoints).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (possibleConnections->unconnectedTargetEndpoints).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar2) {
    puVar1 = &possibleConnections->potentialEndpoints;
    do {
      puVar7 = puVar1;
      bVar4 = makePotentialConnection
                        (this,*psVar8,&possibleConnections->tagCodes,puVar1,
                         &possibleConnections->aliases);
      if ((!bVar4) && ((possibleConnections->aliases)._M_h._M_element_count != 0)) {
        target_01._M_str = (char *)possibleConnections;
        target_01._M_len = (size_t)psVar8->_M_str;
        generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)&local_60,(apps *)psVar8->_M_len,target_01,
                        (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                         *)puVar7);
        for (p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          sVar3 = *(size_t *)(p_Var6 + 1);
          sVar10 = *(string_view *)(p_Var6 + 1);
          if (sVar3 == psVar8->_M_len) {
            iVar9 = 0x11;
            if (sVar3 != 0) {
              iVar5 = bcmp(p_Var6[1]._M_parent,psVar8->_M_str,sVar3);
              if (iVar5 != 0) goto LAB_002a1749;
            }
          }
          else {
LAB_002a1749:
            bVar4 = makePotentialConnection
                              (this,sVar10,&possibleConnections->tagCodes,puVar1,
                               &possibleConnections->aliases);
            iVar9 = (uint)bVar4 << 4;
          }
          if ((iVar9 != 0x11) && (iVar9 != 0)) break;
        }
        std::
        _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::~_Rb_tree(&local_60);
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar2);
  }
  return;
}

Assistant:

void Connector::scanUnconnectedInterfaces(ConnectionsList& possibleConnections)
{
    /** unconnected inputs*/
    for (const auto& uInp : possibleConnections.unconnectedInputs) {
        if (makePotentialConnection(uInp,
                                    possibleConnections.tagCodes,
                                    possibleConnections.potentialPubs,
                                    possibleConnections.aliases)) {
            continue;
        }
        if (!possibleConnections.aliases.empty()) {
            auto aliasList = generateAliases(uInp, possibleConnections.aliases);
            for (const auto& alias : aliasList) {
                if (alias == uInp) {
                    continue;
                }
                if (makePotentialConnection(alias,
                                            possibleConnections.tagCodes,
                                            possibleConnections.potentialPubs,
                                            possibleConnections.aliases)) {
                    break;
                }
            }
        }
    }

    /** unconnected publications*/
    for (const auto& uPub : possibleConnections.unconnectedPubs) {
        if (makePotentialConnection(uPub,
                                    possibleConnections.tagCodes,
                                    possibleConnections.potentialInputs,
                                    possibleConnections.aliases)) {
            continue;
        }
        if (!possibleConnections.aliases.empty()) {
            auto aliasList = generateAliases(uPub, possibleConnections.aliases);
            for (const auto& alias : aliasList) {
                if (alias == uPub) {
                    continue;
                }
                if (makePotentialConnection(alias,
                                            possibleConnections.tagCodes,
                                            possibleConnections.potentialInputs,
                                            possibleConnections.aliases)) {
                    break;
                }
            }
        }
    }

    /** unconnected source endpoints*/
    for (const auto& uEnd : possibleConnections.unconnectedSourceEndpoints) {
        if (makePotentialConnection(uEnd,
                                    possibleConnections.tagCodes,
                                    possibleConnections.potentialEndpoints,
                                    possibleConnections.aliases)) {
            continue;
        }
        if (!possibleConnections.aliases.empty()) {
            auto aliasList = generateAliases(uEnd, possibleConnections.aliases);
            for (const auto& alias : aliasList) {
                if (alias == uEnd) {
                    continue;
                }
                if (makePotentialConnection(alias,
                                            possibleConnections.tagCodes,
                                            possibleConnections.potentialEndpoints,
                                            possibleConnections.aliases)) {
                    break;
                }
            }
        }
    }

    /** unconnected target endpoints*/
    for (const auto& uEnd : possibleConnections.unconnectedTargetEndpoints) {
        if (makePotentialConnection(uEnd,
                                    possibleConnections.tagCodes,
                                    possibleConnections.potentialEndpoints,
                                    possibleConnections.aliases)) {
            continue;
        }
        if (!possibleConnections.aliases.empty()) {
            auto aliasList = generateAliases(uEnd, possibleConnections.aliases);
            for (const auto& alias : aliasList) {
                if (alias == uEnd) {
                    continue;
                }
                if (makePotentialConnection(alias,
                                            possibleConnections.tagCodes,
                                            possibleConnections.potentialEndpoints,
                                            possibleConnections.aliases)) {
                    break;
                }
            }
        }
    }
}